

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::dht_mutable_item_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_mutable_item_alert *this)

{
  bool bVar1;
  int64_t iVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  size_t sVar5;
  difference_type in_RCX;
  char *pcVar6;
  span<const_char> in;
  string local_588;
  string local_568;
  char msg [1299];
  
  in.m_len = in_RCX;
  in.m_ptr = (char *)0x20;
  aux::to_hex_abi_cxx11_(&local_588,(aux *)&this->key,in);
  _Var4._M_p = local_588._M_dataplus._M_p;
  iVar2 = this->seq;
  pcVar3 = (this->salt)._M_dataplus._M_p;
  bVar1 = this->authoritative;
  entry::to_string_abi_cxx11_(&local_568,&this->item,false);
  pcVar6 = "non-auth";
  if (bVar1 != false) {
    pcVar6 = "auth";
  }
  snprintf(msg,0x513,"DHT mutable item (key=%s salt=%s seq=%ld %s) [ %s ]",_Var4._M_p,pcVar3,iVar2,
           pcVar6,local_568._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen(msg);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,msg,msg + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_mutable_item_alert::message() const
	{
		char msg[MAX_DHT_MUTABLE_DATA_LENGTH + 50];
		std::snprintf(msg, sizeof(msg), "DHT mutable item (key=%s salt=%s seq=%" PRId64 " %s) [ %s ]"
			, aux::to_hex(key).c_str()
			, salt.c_str()
			, seq
			, authoritative ? "auth" : "non-auth"
			, item.to_string().c_str());
		return msg;
	}